

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

string * __thiscall
vkt::shaderexecutor::intervalToString<tcu::Vector<float,2>>
          (string *__return_storage_ptr__,shaderexecutor *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream local_198 [8];
  ostringstream oss;
  IVal *ival_local;
  FloatFormat *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  printIVal<tcu::Vector<float,2>>((FloatFormat *)this,(IVal *)fmt,(ostream *)local_198);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}